

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::GetFileExtension(string *__return_storage_ptr__,string *file_name)

{
  long lVar1;
  allocator local_31;
  string name;
  
  GetFileName(&name,file_name);
  lVar1 = ::std::__cxx11::string::rfind((char)&name,0x2e);
  if (lVar1 + 1U < 2) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,&local_31);
  }
  else {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&name);
  }
  ::std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::GetFileExtension(const string &file_name) {
	auto name = GetFileName(file_name);
	idx_t pos = name.find_last_of('.');
	// We dont consider e.g. `.gitignore` to have an extension
	if (pos == string::npos || pos == 0) {
		return "";
	}
	return name.substr(pos + 1);
}